

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableHeadersRow(void)

{
  undefined8 uVar1;
  ImGuiTable *pIVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  float fVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  ImVec2 mouse_pos;
  char *name;
  int column_n;
  int columns_count;
  float row_height;
  float row_y1;
  ImGuiTable *table;
  ImGuiContext *g;
  char *in_stack_000000e0;
  ImGuiTable *in_stack_000000f0;
  char *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  float fVar10;
  char *in_stack_ffffffffffffffd0;
  int column_n_00;
  int local_28;
  float fStack_18;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  pIVar2 = GImGui->CurrentTable;
  if ((pIVar2->IsLayoutLocked & 1U) == 0) {
    TableUpdateLayout(in_stack_000000f0);
  }
  auVar8._0_8_ = GetCursorScreenPos();
  auVar8._8_56_ = extraout_var;
  uVar1 = vmovlpd_avx(auVar8._0_16_);
  fStack_18 = (float)((ulong)uVar1 >> 0x20);
  fVar7 = TableGetHeaderRowHeight();
  TableNextRow((ImGuiTableRowFlags)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
               SUB84(in_stack_ffffffffffffffc0,0));
  if ((pIVar2->HostSkipItems & 1U) == 0) {
    iVar4 = TableGetColumnCount();
    for (local_28 = 0; column_n_00 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
        local_28 < iVar4; local_28 = local_28 + 1) {
      bVar3 = TableSetColumnIndex((int)in_stack_ffffffffffffffc0);
      if (bVar3) {
        uVar5 = TableGetColumnFlags((int)in_stack_ffffffffffffffc0);
        if ((uVar5 & 0x1000) == 0) {
          in_stack_ffffffffffffffc0 =
               TableGetColumnName((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
        }
        else {
          in_stack_ffffffffffffffc0 = "";
        }
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffc0;
        PushID((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
        TableHeader(in_stack_000000e0);
        PopID();
      }
    }
    auVar9._0_8_ = GetMousePos();
    auVar9._8_56_ = extraout_var_00;
    uVar1 = vmovlpd_avx(auVar9._0_16_);
    fVar10 = (float)((ulong)uVar1 >> 0x20);
    bVar3 = IsMouseReleased(1);
    if ((((bVar3) && (iVar6 = TableGetHoveredColumn(), iVar6 == iVar4)) && (fStack_18 <= fVar10)) &&
       (fVar10 < fStack_18 + fVar7)) {
      TableOpenContextMenu(column_n_00);
    }
  }
  return;
}

Assistant:

void ImGui::TableHeadersRow()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeadersRow() after BeginTable()!");

    // Layout if not already done (this is automatically done by TableNextRow, we do it here solely to facilitate stepping in debugger as it is frequent to step in TableUpdateLayout)
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    // Open row
    const float row_y1 = GetCursorScreenPos().y;
    const float row_height = TableGetHeaderRowHeight();
    TableNextRow(ImGuiTableRowFlags_Headers, row_height);
    if (table->HostSkipItems) // Merely an optimization, you may skip in your own code.
        return;

    const int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        if (!TableSetColumnIndex(column_n))
            continue;

        // Push an id to allow unnamed labels (generally accidental, but let's behave nicely with them)
        // - in your own code you may omit the PushID/PopID all-together, provided you know they won't collide
        // - table->InstanceCurrent is only >0 when we use multiple BeginTable/EndTable calls with same identifier.
        const char* name = (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_NoHeaderLabel) ? "" : TableGetColumnName(column_n);
        PushID(table->InstanceCurrent * table->ColumnsCount + column_n);
        TableHeader(name);
        PopID();
    }

    // Allow opening popup from the right-most section after the last column.
    ImVec2 mouse_pos = ImGui::GetMousePos();
    if (IsMouseReleased(1) && TableGetHoveredColumn() == columns_count)
        if (mouse_pos.y >= row_y1 && mouse_pos.y < row_y1 + row_height)
            TableOpenContextMenu(-1); // Will open a non-column-specific popup.
}